

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O2

int TBoardToInt(TBoard *board)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar1 = *(undefined1 (*) [16])(board->_M_elems[0]._M_elems + 1);
  auVar2 = *(undefined1 (*) [16])(board->_M_elems[1]._M_elems + 2);
  return (int)((auVar2._8_8_ & 0xffffffff) * 0x88b) + auVar2._12_4_ * 0x19a1 +
         (int)((auVar1._8_8_ & 0xffffffff) * 0x1b) + auVar1._12_4_ * 0x51 +
         auVar2._0_4_ * 0xf3 + auVar2._4_4_ * 0x2d9 + auVar1._0_4_ * 3 + auVar1._4_4_ * 9 +
         board->_M_elems[0]._M_elems[0];
}

Assistant:

static int
TBoardToInt(const TBoard &board)
{
    return board[0][0] * g_factors[0] + board[0][1] * g_factors[1] + board[0][2] * g_factors[2] +
           board[1][0] * g_factors[3] + board[1][1] * g_factors[4] + board[1][2] * g_factors[5] +
           board[2][0] * g_factors[6] + board[2][1] * g_factors[7] + board[2][2] * g_factors[8];
}